

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlSetAttrItem::DebugXmlRhs
          (GdlSetAttrItem *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur)

{
  GdlAttrValueSpec *this_00;
  pointer pcVar1;
  string sVar2;
  bool bVar3;
  ostream *poVar4;
  pointer ppGVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  undefined1 *puVar10;
  undefined8 in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)strmOut,"          <rhsSlot className=\"",0x1e);
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,(this->super_GdlRuleItem).m_psymInput);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)strmOut,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"\" assignmentGdl=\"",0x11);
    (*(this->super_GdlRuleItem)._vptr_GdlRuleItem[0x27])(this,pcman,0,0,strmOut,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" slotIndex=\"",0xd);
  poVar4 = (ostream *)
           std::ostream::operator<<(strmOut,(this->super_GdlRuleItem).m_iritContextPos + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  ppGVar5 = (this->m_vpavs).
            super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppGVar5) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      bVar3 = GrcSymbolTableEntry::IsAttachment(ppGVar5[uVar6]->m_psymName);
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)strmOut,">\n            <slotAttrs",0x18);
        ppGVar5 = (this->m_vpavs).
                  super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((this->m_vpavs).
            super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppGVar5) {
          uVar6 = 0;
          uVar8 = 1;
          do {
            this_00 = ppGVar5[uVar6];
            pcVar1 = (staPathToCur->_M_dataplus)._M_p;
            puVar10 = &stack0xffffffffffffffa0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&stack0xffffffffffffff90,pcVar1,
                       pcVar1 + staPathToCur->_M_string_length);
            sVar2._M_string_length = (size_type)puVar10;
            sVar2._M_dataplus._M_p = (pointer)pcman;
            sVar2.field_2._M_allocated_capacity = in_stack_ffffffffffffff98;
            sVar2.field_2._8_8_ = in_stack_ffffffffffffffa0;
            GdlAttrValueSpec::DebugXml(this_00,pcman,(ostream *)strmOut,sVar2);
            if (puVar10 != &stack0xffffffffffffffa0) {
              operator_delete(puVar10,in_stack_ffffffffffffffa0 + 1);
            }
            ppGVar5 = (this->m_vpavs).
                      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            bVar3 = uVar8 < (ulong)((long)(this->m_vpavs).
                                          super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar5
                                   >> 3);
            uVar6 = uVar8;
            uVar8 = (ulong)((int)uVar8 + 1);
          } while (bVar3);
        }
        pcVar9 = " />\n          </rhsSlot>\n";
        lVar7 = 0x19;
        goto LAB_0011c7af;
      }
      ppGVar5 = (this->m_vpavs).
                super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar3 = uVar8 < (ulong)((long)(this->m_vpavs).
                                    super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar5 >> 3)
      ;
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar3);
  }
  pcVar9 = "/>\n";
  lVar7 = 3;
LAB_0011c7af:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,pcVar9,lVar7);
  return;
}

Assistant:

void GdlSetAttrItem::DebugXmlRhs(GrcManager * pcman, std::ofstream & strmOut,
	std::string staPathToCur)
{
	strmOut << "          <rhsSlot className=\"" << m_psymInput->FullAbbrev();
	if (m_vpavs.size() > 0)
	{
		strmOut << "\" assignmentGdl=\"";
		AttrSetterPrettyPrint(pcman, NULL, 0, strmOut, true);	// NULL and 0 are bogus but not used
	}

	strmOut << "\" slotIndex=\"" << m_iritContextPos + 1 << "\"";

	bool fNeedSlotAttrs = false;
	for (unsigned ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
	{
		// For now, we only need attachment slot attributes.
		if (m_vpavs[ipavs]->m_psymName->IsAttachment())
		{
			fNeedSlotAttrs = true;
			break;
		}
	}
	if (fNeedSlotAttrs)
	{
		strmOut << ">\n            <slotAttrs";
		for (unsigned ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
		{
			m_vpavs[ipavs]->DebugXml(pcman, strmOut, staPathToCur);
		}
		strmOut << " />\n          </rhsSlot>\n";
	}
	else
	{
		strmOut << "/>\n";
	}
}